

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O1

void __thiscall
Am_Drawonable_Impl::Draw_Rectangle
          (Am_Drawonable_Impl *this,Am_Style *ls,Am_Style *fs,int left,int top,int width,int height,
          Am_Draw_Function f)

{
  Display *pDVar1;
  GC p_Var2;
  bool bVar3;
  short sVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  
  if (0 < height && 0 < width) {
    pDVar1 = this->screen->display;
    p_Var2 = this->screen->gc;
    bVar3 = Am_Style::Valid(ls);
    if (bVar3) {
      sVar4 = get_graphical_line_thickness(ls);
      iVar5 = (int)sVar4;
      if (height < iVar5 * 2 || width < iVar5 * 2) {
        set_gc_using_fill(this,ls,f,0);
        XFillRectangle(pDVar1,this->xlib_drawable,p_Var2,CONCAT44(in_register_0000000c,left),top,
                       width,height);
      }
      else {
        bVar3 = Am_Style::Valid(fs);
        if (bVar3) {
          set_gc_using_fill(this,fs,f,0);
          XSetTSOrigin(this->screen->display,this->screen->gc,0,0);
          XFillRectangle(pDVar1,this->xlib_drawable,p_Var2,iVar5 + left,iVar5 + top,
                         width + iVar5 * -2,height + iVar5 * -2);
        }
        set_gc_using_line(this,ls,f);
        XDrawRectangle(pDVar1,this->xlib_drawable,p_Var2,left + iVar5 / 2,top + iVar5 / 2,
                       width - iVar5,height - iVar5);
      }
    }
    else {
      bVar3 = Am_Style::Valid(fs);
      if (bVar3) {
        set_gc_using_fill(this,fs,f,0);
        XFillRectangle(pDVar1,this->xlib_drawable,p_Var2,left,top,width);
        return;
      }
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Rectangle(const Am_Style &ls, const Am_Style &fs,
                                   int left, int top, int width, int height,
                                   Am_Draw_Function f)
{
  if ((width <= 0) || (height <= 0))
    return;

  GC gc = screen->gc;
  Display *disp = screen->display;

  if (ls.Valid()) { //if there is a line style
    short thickness = get_graphical_line_thickness(ls);
    int th2 = thickness * 2;
    int half_thickness = thickness / 2;
    if ((height < th2) ||
        (width < th2)) { // line-style too thick to fit in bbox,
      //so fill bbox with line-style color
      set_gc_using_fill(ls, f);
      XFillRectangle(disp, xlib_drawable, gc, left, top, width, height);
    } else { // The usual case -- bbox can accommodate the line-style
      if (fs.Valid()) {
        set_gc_using_fill(fs, f);
        // keep origin of stipple, if any, in the same spot.
        XSetTSOrigin(screen->display, screen->gc, 0, 0);
        XFillRectangle(disp, xlib_drawable, gc, (left + thickness),
                       (top + thickness), (width - th2), (height - th2));
      }
      set_gc_using_line(ls, f);
      XDrawRectangle(disp, xlib_drawable, gc, (left + half_thickness),
                     (top + half_thickness), (width - thickness),
                     (height - thickness));
    }
  } else {            // No line style
    if (fs.Valid()) { //if there is a filling style but no line style
      set_gc_using_fill(fs, f);
      XFillRectangle(disp, xlib_drawable, gc, left, top, width, height);
    }
  }
}